

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int streamParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  xmlTextReaderPtr reader_00;
  int ret;
  xmlTextReaderPtr reader;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  reader_00 = (xmlTextReaderPtr)xmlReaderForFile(filename,0,options);
  iVar1 = streamProcessTest(filename,result,err,reader_00,(char *)0x0,options);
  xmlFreeTextReader(reader_00);
  return iVar1;
}

Assistant:

static int
streamParseTest(const char *filename, const char *result, const char *err,
                int options) {
    xmlTextReaderPtr reader;
    int ret;

    reader = xmlReaderForFile(filename, NULL, options);
    ret = streamProcessTest(filename, result, err, reader, NULL, options);
    xmlFreeTextReader(reader);
    return(ret);
}